

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

int Llb_NonlinNextPartitions(Llb_Mgr_t *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Llb_Prt_t *pLVar6;
  Llb_Prt_t *pLVar7;
  int iVar8;
  Llb_Var_t *pLVar9;
  Llb_Prt_t *pLVar10;
  Llb_Prt_t *pLVar11;
  
  Llb_NonlinCheckVars(p);
  uVar5 = 0;
  uVar4 = (ulong)(uint)p->nVars;
  if (p->nVars < 1) {
    uVar4 = uVar5;
  }
  pLVar9 = (Llb_Var_t *)0x0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pLVar1 = p->pVars[uVar5];
    if ((pLVar1 != (Llb_Var_t *)0x0) &&
       ((pLVar9 == (Llb_Var_t *)0x0 || (pLVar1->nScore < pLVar9->nScore)))) {
      pLVar9 = pLVar1;
    }
  }
  if (pLVar9 == (Llb_Var_t *)0x0) {
    iVar8 = 0;
  }
  else {
    pLVar6 = (Llb_Prt_t *)0x0;
    pLVar10 = (Llb_Prt_t *)0x0;
    for (iVar8 = 0; iVar8 < pLVar9->vParts->nSize; iVar8 = iVar8 + 1) {
      iVar3 = Vec_IntEntry(pLVar9->vParts,iVar8);
      pLVar2 = p->pParts[iVar3];
      pLVar7 = pLVar6;
      pLVar11 = pLVar2;
      if ((pLVar10 != (Llb_Prt_t *)0x0) &&
         (pLVar7 = pLVar2, pLVar11 = pLVar10, pLVar6 != (Llb_Prt_t *)0x0)) {
        if (((pLVar2->nSize < pLVar10->nSize) || (pLVar7 = pLVar6, pLVar2->nSize < pLVar6->nSize))
           && (pLVar7 = pLVar6, pLVar11 = pLVar2, pLVar10->nSize <= pLVar6->nSize)) {
          pLVar7 = pLVar2;
          pLVar11 = pLVar10;
        }
      }
      pLVar6 = pLVar7;
      pLVar10 = pLVar11;
    }
    *ppPart1 = pLVar10;
    *ppPart2 = pLVar6;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Llb_NonlinNextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_NonlinCheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}